

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoSwitches.hpp
# Opt level: O2

void __thiscall
Apple::II::VideoSwitches<Cycles>::set_character_rom
          (VideoSwitches<Cycles> *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *rom)

{
  byte *pbVar1;
  iterator __begin4;
  byte *pbVar2;
  byte bVar3;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->character_rom_,rom);
  pbVar2 = (this->character_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pbVar2[0x121] == 0x3c) || (pbVar2[0x122] == 0x3c)) {
    pbVar1 = (this->character_rom_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
      bVar3 = *pbVar2 << 4 | *pbVar2 >> 4;
      bVar3 = bVar3 >> 2 & 0x33 | (bVar3 & 0x33) << 2;
      *pbVar2 = (byte)(bVar3 >> 1 & 0x54 | (bVar3 & 0x55) * '\x02') >> 1;
    }
  }
  return;
}

Assistant:

void set_character_rom(const std::vector<uint8_t> &rom) {
			character_rom_ = rom;

			// There's some inconsistency in bit ordering amongst the common ROM dumps;
			// detect that based arbitrarily on the second line of the $ graphic and
			// ensure consistency.
			if(character_rom_[0x121] == 0x3c || character_rom_[0x122] == 0x3c) {
				for(auto &graphic : character_rom_) {
					graphic =
						((graphic & 0x01) ? 0x40 : 0x00) |
						((graphic & 0x02) ? 0x20 : 0x00) |
						((graphic & 0x04) ? 0x10 : 0x00) |
						((graphic & 0x08) ? 0x08 : 0x00) |
						((graphic & 0x10) ? 0x04 : 0x00) |
						((graphic & 0x20) ? 0x02 : 0x00) |
						((graphic & 0x40) ? 0x01 : 0x00);
				}
			}
		}